

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkBalance(Abc_Ntk_t *pNtk,int fDuplicate,int fSelective,int fUpdateLevel)

{
  Abc_Obj_t *pObj;
  long lVar1;
  long *plVar2;
  long *plVar3;
  void *__ptr;
  int iVar4;
  Abc_Ntk_t *pNtkNew;
  Vec_Vec_t *vStorage;
  void **ppvVar5;
  undefined8 *puVar6;
  ProgressBar *p;
  Vec_Ptr_t *pVVar7;
  Abc_Ntk_t *pAVar8;
  int iVar9;
  uint uVar10;
  int nItemsCur;
  long lVar11;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0x39,"Abc_Ntk_t *Abc_NtkBalance(Abc_Ntk_t *, int, int, int)");
  }
  if (fSelective != 0) {
    uVar10 = 0;
    Abc_NtkStartReverseLevels(pNtk,0);
    pVVar7 = pNtk->vObjs;
    if (0 < pVVar7->nSize) {
      lVar11 = 0;
      uVar10 = 0;
      do {
        pObj = (Abc_Obj_t *)pVVar7->pArray[lVar11];
        if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
          iVar4 = Abc_ObjRequiredLevel(pObj);
          if ((int)(iVar4 - (*(uint *)&pObj->field_0x14 >> 0xc)) < 2) {
            *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x10;
            uVar10 = uVar10 + 1;
          }
        }
        lVar11 = lVar11 + 1;
        pVVar7 = pNtk->vObjs;
      } while (lVar11 < pVVar7->nSize);
    }
    printf("The number of nodes on the critical paths = %6d  (%5.2f %%)\n",
           ((double)(int)uVar10 * 100.0) / (double)pNtk->nObjCounts[7],(ulong)uVar10);
  }
  pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  pVVar7 = pNtk->vCis;
  if (0 < pVVar7->nSize) {
    lVar11 = 0;
    do {
      lVar1 = *(long *)((long)pVVar7->pArray[lVar11] + 0x40);
      *(uint *)(lVar1 + 0x14) =
           *(uint *)(lVar1 + 0x14) & 0xfff |
           *(uint *)((long)pVVar7->pArray[lVar11] + 0x14) & 0xfffff000;
      lVar11 = lVar11 + 1;
      pVVar7 = pNtk->vCis;
    } while (lVar11 < pVVar7->nSize);
  }
  Abc_NtkSetNodeLevelsArrival(pNtk);
  vStorage = (Vec_Vec_t *)malloc(0x10);
  vStorage->nCap = 10;
  vStorage->nSize = 0;
  ppvVar5 = (void **)malloc(0x50);
  vStorage->pArray = ppvVar5;
  lVar11 = 0;
  do {
    puVar6 = (undefined8 *)malloc(0x10);
    *puVar6 = 0;
    puVar6[1] = 0;
    ppvVar5[lVar11] = puVar6;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 10);
  vStorage->nSize = 10;
  p = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
  pVVar7 = pNtk->vCos;
  iVar4 = pVVar7->nSize;
  if (pNtk->nBarBufs == 0) {
    if (0 < iVar4) {
      lVar11 = 0;
      do {
        plVar2 = (long *)pVVar7->pArray[lVar11];
        if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar11)) {
          Extra_ProgressBarUpdate_int(p,(int)lVar11,(char *)0x0);
        }
        Abc_NodeBalance_rec(pNtkNew,*(Abc_Obj_t **)
                                     (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                     (long)*(int *)plVar2[4] * 8),vStorage,0,fDuplicate,fSelective,
                            fUpdateLevel);
        lVar11 = lVar11 + 1;
        pVVar7 = pNtk->vCos;
      } while (lVar11 < pVVar7->nSize);
    }
  }
  else if (0 < iVar4) {
    nItemsCur = 0;
    do {
      iVar9 = 0;
      if (nItemsCur < pNtk->nBarBufs) {
        iVar9 = iVar4;
      }
      uVar10 = (iVar9 - pNtk->nBarBufs) + nItemsCur;
      if (((int)uVar10 < 0) || (iVar4 <= (int)uVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar2 = (long *)pVVar7->pArray[uVar10];
      if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= nItemsCur)) {
        Extra_ProgressBarUpdate_int(p,nItemsCur,(char *)0x0);
      }
      Abc_NodeBalance_rec(pNtkNew,*(Abc_Obj_t **)
                                   (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                   (long)*(int *)plVar2[4] * 8),vStorage,0,fDuplicate,fSelective,
                          fUpdateLevel);
      if (nItemsCur < pNtk->nBarBufs) {
        lVar11 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
        plVar3 = *(long **)(lVar11 + (long)*(int *)plVar2[6] * 8);
        lVar1 = *(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
        *(uint *)(lVar1 + 0x14) =
             *(uint *)(lVar1 + 0x14) & 0xfff |
             *(uint *)(*(long *)(lVar11 + (long)*(int *)plVar2[4] * 8) + 0x14) & 0xfffff000;
      }
      nItemsCur = nItemsCur + 1;
      pVVar7 = pNtk->vCos;
      iVar4 = pVVar7->nSize;
    } while (nItemsCur < iVar4);
  }
  Extra_ProgressBarStop(p);
  iVar4 = vStorage->nSize;
  if (0 < (long)iVar4) {
    ppvVar5 = vStorage->pArray;
    lVar11 = 0;
    do {
      __ptr = ppvVar5[lVar11];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
          *(undefined8 *)((long)__ptr + 8) = 0;
        }
        free(__ptr);
      }
      lVar11 = lVar11 + 1;
    } while (iVar4 != lVar11);
  }
  if (vStorage->pArray != (void **)0x0) {
    free(vStorage->pArray);
    vStorage->pArray = (void **)0x0;
  }
  free(vStorage);
  Abc_NtkFinalize(pNtk,pNtkNew);
  Abc_AigCleanup((Abc_Aig_t *)pNtkNew->pManFunc);
  if (fSelective != 0) {
    Abc_NtkStopReverseLevels(pNtk);
    Abc_NtkCleanMarkA(pNtk);
  }
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    pAVar8 = Abc_NtkDup(pNtk->pExdc);
    pNtkNew->pExdc = pAVar8;
  }
  iVar4 = Abc_NtkCheck(pNtkNew);
  if (iVar4 == 0) {
    puts("Abc_NtkBalance: The network check has failed.");
    Abc_NtkDelete(pNtkNew);
    pNtkNew = (Abc_Ntk_t *)0x0;
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkBalance( Abc_Ntk_t * pNtk, int fDuplicate, int fSelective, int fUpdateLevel )
{
//    extern void Abc_NtkHaigTranfer( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew );
    Abc_Ntk_t * pNtkAig;
    assert( Abc_NtkIsStrash(pNtk) );
    // compute the required times
    if ( fSelective )
    {
        Abc_NtkStartReverseLevels( pNtk, 0 );
        Abc_NtkMarkCriticalNodes( pNtk );
    }
    // perform balancing
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // transfer HAIG
//    Abc_NtkHaigTranfer( pNtk, pNtkAig );
    // perform balancing
    Abc_NtkBalancePerform( pNtk, pNtkAig, fDuplicate, fSelective, fUpdateLevel );
    Abc_NtkFinalize( pNtk, pNtkAig );
    Abc_AigCleanup( (Abc_Aig_t *)pNtkAig->pManFunc );
    // undo the required times
    if ( fSelective )
    {
        Abc_NtkStopReverseLevels( pNtk );
        Abc_NtkCleanMarkA( pNtk );
    }
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkBalance: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
//Abc_NtkPrintCiLevels( pNtkAig );
    return pNtkAig;
}